

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O3

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneBspTreeIndexPrivate::estimateItems
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsSceneBspTreeIndexPrivate *this,
          QRectF *rect,SortOrder order,bool onlyTopLevelItems)

{
  long lVar1;
  long *plVar2;
  QGraphicsItem **b;
  QGraphicsItem *this_00;
  qsizetype i;
  long lVar3;
  undefined7 in_register_00000081;
  ulong uVar4;
  long in_FS_OFFSET;
  QGraphicsItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000081,onlyTopLevelItems) == 0) {
    purgeRemovedItems(this);
    _q_updateSortCache(this);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneBspTree::items(__return_storage_ptr__,&this->bsp,rect,false);
    b = (this->untransformableItems).d.ptr;
    QtPrivate::QCommonArrayOps<QGraphicsItem_*>::growAppend
              ((QCommonArrayOps<QGraphicsItem_*> *)__return_storage_ptr__,b,
               b + (this->untransformableItems).d.size);
  }
  else {
    if ((((rect->w == 0.0) && (!NAN(rect->w))) && (rect->h == 0.0)) && (!NAN(rect->h))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QGraphicsSceneIndex::estimateTopLevelItems
                  (__return_storage_ptr__,
                   *(QGraphicsSceneIndex **)&(this->super_QGraphicsSceneIndexPrivate).field_0x8,rect
                   ,order);
        return __return_storage_ptr__;
      }
      goto LAB_00623f92;
    }
    purgeRemovedItems(this);
    _q_updateSortCache(this);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneBspTree::items(__return_storage_ptr__,&this->bsp,rect,true);
    if ((this->untransformableItems).d.size != 0) {
      uVar4 = 0;
      do {
        this_00 = (this->untransformableItems).d.ptr[uVar4];
        if (((this_00->d_ptr).d)->parent == (QGraphicsItem *)0x0) {
          i = (__return_storage_ptr__->d).size;
LAB_00623f3b:
          local_40 = this_00;
          QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                    ((QPodArrayOps<QGraphicsItem*> *)__return_storage_ptr__,i,&local_40);
          QList<QGraphicsItem_*>::end(__return_storage_ptr__);
        }
        else {
          this_00 = QGraphicsItem::topLevelItem(this_00);
          i = (__return_storage_ptr__->d).size;
          if (i == 0) goto LAB_00623f3b;
          lVar3 = 0;
          do {
            if (i * 8 - lVar3 == 0) goto LAB_00623f3b;
            lVar1 = lVar3 + 8;
            plVar2 = (long *)((long)(__return_storage_ptr__->d).ptr + lVar3);
            lVar3 = lVar1;
          } while ((QGraphicsItem *)*plVar2 != this_00);
          if (lVar1 == 0) goto LAB_00623f3b;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)(this->untransformableItems).d.size);
    }
  }
  sortItems(__return_storage_ptr__,order,this->sortCacheEnabled,onlyTopLevelItems);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00623f92:
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneBspTreeIndexPrivate::estimateItems(const QRectF &rect, Qt::SortOrder order,
                                                                        bool onlyTopLevelItems)
{
    Q_Q(QGraphicsSceneBspTreeIndex);
    if (onlyTopLevelItems && rect.isNull())
        return q->QGraphicsSceneIndex::estimateTopLevelItems(rect, order);

    purgeRemovedItems();
    _q_updateSortCache();
    Q_ASSERT(unindexedItems.isEmpty());

    QList<QGraphicsItem *> rectItems = bsp.items(rect, onlyTopLevelItems);
    if (onlyTopLevelItems) {
        for (int i = 0; i < untransformableItems.size(); ++i) {
            QGraphicsItem *item = untransformableItems.at(i);
            if (!item->d_ptr->parent) {
                rectItems << item;
            } else {
                item = item->topLevelItem();
                if (!rectItems.contains(item))
                    rectItems << item;
            }
        }
    } else {
        rectItems += untransformableItems;
    }

    sortItems(&rectItems, order, sortCacheEnabled, onlyTopLevelItems);
    return rectItems;
}